

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  float *scanline;
  undefined4 uVar1;
  stbtt__point sVar2;
  stbtt__point sVar3;
  undefined4 uVar4;
  stbtt__active_edge *psVar5;
  undefined8 *puVar6;
  undefined4 uVar7;
  stbtt__active_edge *z;
  ulong uVar8;
  stbtt__point *__ptr;
  stbtt__point *points;
  stbtt__edge *p_00;
  float *scanline_00;
  undefined8 *puVar9;
  stbtt__active_edge *psVar10;
  long lVar11;
  uchar uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  stbtt__edge *psVar16;
  stbtt__active_edge *psVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  stbtt__edge *psVar22;
  ulong uVar23;
  void *p;
  stbtt__active_edge *psVar24;
  long lVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float bx0;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float local_2e8;
  stbtt__active_edge *active;
  float local_2c0;
  float local_2bc;
  float y0;
  long local_2a0;
  undefined8 *local_298;
  stbtt__point *local_290;
  stbtt__bitmap *local_288;
  int local_280;
  float local_27c;
  undefined1 local_278 [16];
  ulong local_260;
  stbtt__edge *local_258;
  stbtt__edge *local_250;
  undefined1 local_248 [16];
  ulong local_238;
  int local_230;
  
  fVar29 = scale_y;
  if (scale_x <= scale_y) {
    fVar29 = scale_x;
  }
  uVar8 = 0;
  uVar15 = (ulong)(uint)num_verts;
  if (num_verts < 1) {
    uVar15 = uVar8;
  }
  uVar14 = 0;
  for (; uVar15 * 0xe - uVar8 != 0; uVar8 = uVar8 + 0xe) {
    uVar14 = (ulong)((int)uVar14 + (uint)((&vertices->type)[uVar8] == '\x01'));
  }
  if (((int)uVar14 == 0) ||
     (y0 = shift_y, local_288 = result, __ptr = (stbtt__point *)malloc(uVar14 * 4),
     __ptr == (stbtt__point *)0x0)) {
    return;
  }
  local_278._0_4_ = x_off;
  fVar27 = (flatness_in_pixels / fVar29) * (flatness_in_pixels / fVar29);
  points = (stbtt__point *)0x0;
  fVar28 = 0.0;
  iVar21 = 0;
  fVar29 = 0.0;
  local_260 = (ulong)(uint)y_off;
  do {
    if (iVar21 == 1) {
      points = (stbtt__point *)malloc((long)(int)fVar29 << 3);
      if (points == (stbtt__point *)0x0) goto LAB_001836ee;
    }
    else if (iVar21 == 2) {
      if (points == (stbtt__point *)0x0) {
        return;
      }
      iVar21 = 0;
      uVar7 = local_278._0_4_;
      for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        iVar21 = iVar21 + (int)(&__ptr->x)[uVar15];
      }
      local_2e8 = scale_y;
      if (invert != 0) {
        local_2e8 = -scale_y;
      }
      local_290 = points;
      p_00 = (stbtt__edge *)malloc((long)(iVar21 + 1) * 0x14);
      if (p_00 != (stbtt__edge *)0x0) {
        iVar21 = 0;
        iVar19 = 0;
        for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
          fVar29 = (&__ptr->x)[uVar15];
          uVar18 = (ulong)((int)fVar29 - 1);
          uVar8 = 0;
          if (0 < (int)fVar29) {
            uVar8 = (ulong)(uint)fVar29;
          }
          for (uVar23 = 0; iVar13 = (int)uVar18, uVar8 != uVar23; uVar23 = uVar23 + 1) {
            uVar18 = (ulong)iVar13;
            fVar28 = local_290[(long)iVar21 + uVar18].y;
            fVar27 = local_290[(long)iVar21 + uVar23].y;
            if ((fVar28 != fVar27) || (NAN(fVar28) || NAN(fVar27))) {
              psVar16 = p_00 + iVar19;
              p_00[iVar19].invert = 0;
              if (invert == 0) {
                if (fVar27 <= fVar28) goto LAB_00182bc8;
LAB_00182bb6:
                psVar16->invert = 1;
                uVar18 = uVar23;
              }
              else {
                if (fVar27 < fVar28) goto LAB_00182bb6;
LAB_00182bc8:
                iVar13 = (int)uVar23;
              }
              sVar2 = local_290[(long)iVar21 + (long)iVar13];
              sVar3 = local_290[(long)iVar21 + uVar18];
              psVar16->x0 = sVar2.x * scale_x + shift_x;
              psVar16->y0 = sVar2.y * local_2e8 + y0;
              psVar16->x1 = sVar3.x * scale_x + shift_x;
              psVar16->y1 = sVar3.y * local_2e8 + y0;
              iVar19 = iVar19 + 1;
            }
            uVar18 = uVar23 & 0xffffffff;
          }
          iVar21 = (int)fVar29 + iVar21;
        }
        stbtt__sort_edges_quicksort(p_00,iVar19);
        scanline_00 = (float *)&local_238;
        psVar16 = p_00;
        for (uVar15 = 1; (long)uVar15 < (long)iVar19; uVar15 = uVar15 + 1) {
          uVar1 = p_00[uVar15].x0;
          uVar4 = p_00[uVar15].y0;
          local_230 = p_00[uVar15].invert;
          local_238._0_4_ = p_00[uVar15].x1;
          local_238._4_4_ = p_00[uVar15].y1;
          psVar22 = psVar16;
          for (uVar8 = uVar15; 0 < (long)uVar8; uVar8 = uVar8 - 1) {
            if (psVar22->y0 <= (float)uVar4) goto LAB_00182c80;
            psVar22[1].invert = psVar22->invert;
            fVar29 = psVar22->y0;
            fVar28 = psVar22->x1;
            fVar27 = psVar22->y1;
            psVar22[1].x0 = psVar22->x0;
            psVar22[1].y0 = fVar29;
            psVar22[1].x1 = fVar28;
            psVar22[1].y1 = fVar27;
            psVar22 = psVar22 + -1;
          }
          uVar8 = 0;
LAB_00182c80:
          iVar21 = (int)uVar8;
          if (uVar15 != (uVar8 & 0xffffffff)) {
            p_00[iVar21].x0 = (float)uVar1;
            p_00[iVar21].y0 = (float)uVar4;
            p_00[iVar21].x1 = (float)local_238;
            p_00[iVar21].y1 = (float)local_238._4_4_;
            p_00[iVar21].invert = local_230;
          }
          psVar16 = psVar16 + 1;
        }
        active = (stbtt__active_edge *)0x0;
        lVar25 = (long)local_288->w;
        if (0x40 < lVar25) {
          scanline_00 = (float *)malloc((ulong)(uint)local_288->w * 8 + 4);
        }
        scanline = scanline_00 + lVar25;
        iVar21 = local_288->h;
        p_00[iVar19].y0 = (float)(iVar21 + (int)local_260) + 1.0;
        local_27c = (float)(int)uVar7;
        psVar24 = (stbtt__active_edge *)0x0;
        local_2bc = 0.0;
        local_298 = (undefined8 *)0x0;
        fVar29 = 0.0;
        uVar15 = local_260;
        local_2a0 = lVar25;
        local_258 = p_00;
        while (psVar16 = local_258, puVar9 = local_298, (int)fVar29 < iVar21) {
          local_280 = (int)uVar15;
          y0 = (float)local_280;
          fVar27 = y0 + 1.0;
          lVar25 = (long)(int)local_2a0;
          local_2c0 = fVar29;
          memset(scanline_00,0,lVar25 * 4);
          fVar28 = local_2c0;
          memset(scanline,0,lVar25 * 4 + 4);
          fVar29 = y0;
          psVar10 = (stbtt__active_edge *)&active;
          while (psVar17 = psVar10, psVar5 = psVar17->next, psVar5 != (stbtt__active_edge *)0x0) {
            psVar10 = psVar5;
            if (psVar5->ey <= fVar29) {
              psVar17->next = psVar5->next;
              if ((psVar5->direction == 0.0) && (!NAN(psVar5->direction))) {
                __assert_fail("z->direction",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                              ,0xd03,
                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                             );
              }
              psVar5->direction = 0.0;
              psVar5->next = psVar24;
              psVar10 = psVar17;
              psVar24 = psVar5;
            }
          }
          bVar26 = (int)local_260 != 0;
          for (; fVar39 = p_00->y0, fVar39 <= fVar27; p_00 = p_00 + 1) {
            fVar35 = p_00->y1;
            if ((fVar39 != fVar35) || (psVar10 = psVar24, NAN(fVar39) || NAN(fVar35))) {
              if (psVar24 == (stbtt__active_edge *)0x0) {
                if (local_2bc == 0.0) {
                  puVar9 = (undefined8 *)malloc(0x6408);
                  if (puVar9 == (undefined8 *)0x0) {
                    __assert_fail("z != ((void*)0)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                  ,0xb2d,
                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                 );
                  }
                  *puVar9 = local_298;
                  local_2bc = 1.11964e-42;
                  fVar29 = y0;
                }
                else {
                  local_2bc = (float)((int)local_2bc + -1);
                  puVar9 = local_298;
                }
                local_298 = puVar9;
                psVar24 = (stbtt__active_edge *)(puVar9 + (long)(int)local_2bc * 4 + 1);
                psVar10 = (stbtt__active_edge *)0x0;
              }
              else {
                psVar10 = psVar24->next;
              }
              fVar36 = p_00->x0;
              fVar32 = (p_00->x1 - fVar36) / (fVar35 - fVar39);
              psVar24->fdx = fVar32;
              psVar24->fdy = (float)(-(uint)(fVar32 != 0.0) & (uint)(1.0 / fVar32));
              psVar24->fx = ((fVar29 - fVar39) * fVar32 + fVar36) - local_27c;
              psVar24->direction = *(float *)(&DAT_00250f30 + (ulong)(p_00->invert == 0) * 4);
              psVar24->sy = fVar39;
              psVar24->ey = fVar35;
              psVar24->next = (stbtt__active_edge *)0x0;
              if (fVar35 < fVar29 && (fVar28 == 0.0 && bVar26)) {
                psVar24->ey = fVar29;
                fVar35 = fVar29;
              }
              if (fVar35 < fVar29) {
                __assert_fail("z->ey >= scan_y_top",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                              ,0xd16,
                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                             );
              }
              psVar24->next = active;
              active = psVar24;
            }
            psVar24 = psVar10;
          }
          if (active != (stbtt__active_edge *)0x0) {
            iVar19 = (int)local_2a0;
            fVar28 = (float)iVar19;
            iVar21 = 0;
            if (0 < iVar19) {
              iVar21 = iVar19;
            }
            local_250 = p_00;
            for (psVar10 = active; p_00 = local_250, psVar10 != (stbtt__active_edge *)0x0;
                psVar10 = psVar10->next) {
              fVar39 = psVar10->ey;
              if (fVar39 < fVar29) {
                __assert_fail("e->ey >= y_top",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                              ,0xc12,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar35 = psVar10->fx;
              fVar36 = psVar10->fdx;
              if ((fVar36 != 0.0) || (NAN(fVar36))) {
                fVar32 = psVar10->sy;
                if (fVar27 < fVar32) {
                  __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                ,0xc25,
                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                               );
                }
                fVar38 = fVar36 + fVar35;
                fVar34 = (float)(~-(uint)(fVar29 < fVar32) & (uint)fVar35 |
                                (uint)((fVar32 - fVar29) * fVar36 + fVar35) &
                                -(uint)(fVar29 < fVar32));
                if ((((fVar34 < 0.0) ||
                     (fVar37 = (float)(~-(uint)(fVar39 < fVar27) & (uint)fVar38 |
                                      (uint)((fVar39 - fVar29) * fVar36 + fVar35) &
                                      -(uint)(fVar39 < fVar27)), fVar37 < 0.0)) ||
                    (fVar28 <= fVar34)) || (fVar28 <= fVar37)) {
                  local_248 = ZEXT416((uint)fVar36);
                  local_278 = ZEXT416((uint)fVar35);
                  iVar19 = 0;
                  while (iVar21 != iVar19) {
                    fVar32 = (float)iVar19;
                    fVar34 = (float)(iVar19 + 1);
                    fVar39 = (fVar32 - fVar35) / fVar36 + fVar29;
                    fVar36 = (fVar34 - fVar35) / fVar36 + fVar29;
                    if ((fVar32 <= fVar35) || (fVar38 <= fVar34)) {
                      if ((fVar32 <= fVar38) || (fVar35 <= fVar34)) {
                        if (((fVar32 <= fVar35) || (fVar38 <= fVar32)) &&
                           ((fVar32 <= fVar38 || (fVar35 <= fVar32)))) {
                          if (((fVar35 < fVar34) && (fVar34 < fVar38)) ||
                             ((fVar32 = fVar35, fVar39 = fVar29, fVar38 < fVar34 &&
                              (fVar34 < fVar35)))) goto LAB_00183219;
                          goto LAB_001832dd;
                        }
                      }
                      else {
                        stbtt__handle_clipped_edge
                                  (scanline_00,iVar19,psVar10,fVar35,fVar29,fVar34,fVar36);
                        fVar35 = fVar34;
                        fVar29 = fVar36;
                      }
                      stbtt__handle_clipped_edge
                                (scanline_00,iVar19,psVar10,fVar35,fVar29,fVar32,fVar39);
                    }
                    else {
                      stbtt__handle_clipped_edge
                                (scanline_00,iVar19,psVar10,fVar35,fVar29,fVar32,fVar39);
                      fVar35 = fVar32;
                      fVar29 = fVar39;
LAB_00183219:
                      stbtt__handle_clipped_edge
                                (scanline_00,iVar19,psVar10,fVar35,fVar29,fVar34,fVar36);
                      fVar32 = fVar34;
                      fVar39 = fVar36;
                    }
LAB_001832dd:
                    stbtt__handle_clipped_edge
                              (scanline_00,iVar19,psVar10,fVar32,fVar39,fVar38,fVar27);
                    fVar35 = (float)local_278._0_4_;
                    fVar36 = (float)local_248._0_4_;
                    fVar29 = y0;
                    iVar19 = iVar19 + 1;
                  }
                }
                else {
                  if (fVar32 <= fVar29) {
                    fVar32 = fVar29;
                  }
                  uVar20 = (uint)fVar34;
                  if (fVar27 <= fVar39) {
                    fVar39 = fVar27;
                  }
                  if (uVar20 == (int)fVar37) {
                    if (((int)uVar20 < 0) || ((int)local_2a0 <= (int)uVar20)) {
                      __assert_fail("x >= 0 && x < len",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc41,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar39 = (fVar39 - fVar32) * psVar10->direction;
                    fVar29 = stbtt__position_trapezoid_area
                                       (fVar39,fVar34,(float)(int)uVar20 + 1.0,fVar37,
                                        (float)(int)uVar20 + 1.0);
                    scanline_00[uVar20] = fVar29 + scanline_00[uVar20];
                    scanline[(ulong)uVar20 + 1] = fVar39 + scanline[(ulong)uVar20 + 1];
                    fVar29 = y0;
                  }
                  else {
                    fVar30 = psVar10->fdy;
                    bx0 = fVar37;
                    if (fVar37 < fVar34) {
                      fVar33 = fVar29 - fVar32;
                      fVar32 = (fVar29 - fVar39) + fVar27;
                      fVar36 = -fVar36;
                      fVar30 = -fVar30;
                      bx0 = fVar34;
                      fVar35 = fVar38;
                      fVar39 = fVar33 + fVar27;
                      fVar34 = fVar37;
                    }
                    if (fVar30 < 0.0) {
                      __assert_fail("dy >= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc53,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    if (fVar36 < 0.0) {
                      __assert_fail("dx >= 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc54,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    iVar13 = (int)fVar34;
                    iVar19 = iVar13 + 1;
                    lVar25 = (long)(int)bx0;
                    fVar37 = ((float)iVar19 - fVar35) * fVar30 + fVar29;
                    fVar38 = (float)(int)bx0;
                    fVar36 = fVar27;
                    if (fVar37 <= fVar27) {
                      fVar36 = fVar37;
                    }
                    fVar37 = psVar10->direction;
                    fVar33 = (fVar36 - fVar32) * fVar37;
                    fVar29 = (fVar38 - fVar35) * fVar30 + fVar29;
                    scanline_00[iVar13] =
                         ((float)iVar19 - fVar34) * fVar33 * 0.5 + scanline_00[iVar13];
                    fVar35 = (float)(~-(uint)(fVar27 < fVar29) & (uint)fVar30 |
                                    (uint)((fVar27 - fVar36) / (float)((int)bx0 - iVar19)) &
                                    -(uint)(fVar27 < fVar29)) * fVar37;
                    for (lVar11 = (long)iVar19; lVar11 < lVar25; lVar11 = lVar11 + 1) {
                      scanline_00[lVar11] = fVar35 * 0.5 + fVar33 + scanline_00[lVar11];
                      fVar33 = fVar33 + fVar35;
                    }
                    if (1.01 < ABS(fVar33)) {
                      __assert_fail("fabs(area) <= 1.01f",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc94,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar35 = fVar27;
                    if (fVar29 <= fVar27) {
                      fVar35 = fVar29;
                    }
                    if (fVar39 <= fVar35 + -0.01) {
                      __assert_fail("sy1 > y_final-0.01f",
                                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                                    ,0xc95,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar29 = stbtt__position_trapezoid_area
                                       (fVar39 - fVar35,fVar38,fVar38 + 1.0,bx0,fVar38 + 1.0);
                    scanline_00[lVar25] = fVar29 * fVar37 + fVar33 + scanline_00[lVar25];
                    scanline[lVar25 + 1] = (fVar39 - fVar32) * fVar37 + scanline[lVar25 + 1];
                    fVar29 = y0;
                  }
                }
              }
              else if (fVar35 < fVar28) {
                if (0.0 <= fVar35) {
                  local_278 = ZEXT416((uint)fVar35);
                  stbtt__handle_clipped_edge
                            (scanline_00,(int)fVar35,psVar10,fVar35,fVar29,fVar35,fVar27);
                  iVar19 = (int)fVar35 + 1;
                  fVar29 = y0;
                  fVar35 = (float)local_278._0_4_;
                }
                else {
                  iVar19 = 0;
                }
                stbtt__handle_clipped_edge(scanline,iVar19,psVar10,fVar35,fVar29,fVar35,fVar27);
                fVar29 = y0;
              }
            }
          }
          fVar29 = 0.0;
          for (lVar25 = 0; local_2a0 = (long)local_288->w, lVar25 < local_2a0; lVar25 = lVar25 + 1)
          {
            fVar29 = fVar29 + scanline[lVar25];
            iVar21 = (int)(ABS(scanline_00[lVar25] + fVar29) * 255.0 + 0.5);
            uVar12 = (uchar)iVar21;
            if (0xfe < iVar21) {
              uVar12 = 0xff;
            }
            local_288->pixels[lVar25 + (long)(int)local_2c0 * (long)local_288->stride] = uVar12;
          }
          psVar10 = (stbtt__active_edge *)&active;
          while (psVar10 = psVar10->next, psVar10 != (stbtt__active_edge *)0x0) {
            psVar10->fx = psVar10->fdx + psVar10->fx;
          }
          uVar15 = (ulong)(local_280 + 1);
          iVar21 = local_288->h;
          fVar29 = (float)((int)local_2c0 + 1);
        }
        while (puVar9 != (undefined8 *)0x0) {
          puVar6 = (undefined8 *)*puVar9;
          free(puVar9);
          puVar9 = puVar6;
        }
        if (scanline_00 != (float *)&local_238) {
          free(scanline_00);
        }
        free(psVar16);
      }
      free(__ptr);
      __ptr = local_290;
LAB_001836ee:
      free(__ptr);
      return;
    }
    local_238 = local_238 & 0xffffffff00000000;
    fVar29 = 0.0;
    fVar39 = 0.0;
    uVar20 = 0xffffffff;
    for (lVar25 = 0; fVar35 = (float)local_238, uVar15 * 0xe - lVar25 != 0; lVar25 = lVar25 + 0xe) {
      switch((&vertices->type)[lVar25]) {
      case '\x01':
        if (-1 < (int)uVar20) {
          (&__ptr->x)[uVar20] = (float)((int)(float)local_238 - (int)fVar28);
        }
        uVar20 = uVar20 + 1;
        auVar31 = ZEXT416(*(uint *)((long)&vertices->x + lVar25));
        auVar31 = pshuflw(auVar31,auVar31,0x60);
        fVar29 = (float)(auVar31._0_4_ >> 0x10);
        fVar39 = (float)(auVar31._4_4_ >> 0x10);
        local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
        fVar28 = fVar35;
        if (points != (stbtt__point *)0x0) {
          points[(int)fVar35].x = fVar29;
          points[(int)fVar35].y = fVar39;
        }
        break;
      case '\x02':
        lVar11 = (long)(int)(float)local_238;
        auVar31 = ZEXT416(*(uint *)((long)&vertices->x + lVar25));
        auVar31 = pshuflw(auVar31,auVar31,0x60);
        fVar29 = (float)(auVar31._0_4_ >> 0x10);
        fVar39 = (float)(auVar31._4_4_ >> 0x10);
        local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
        if (points != (stbtt__point *)0x0) {
          points[lVar11].x = fVar29;
          points[lVar11].y = fVar39;
        }
        break;
      case '\x03':
        stbtt__tesselate_curve
                  (points,(int *)&local_238,fVar29,fVar39,
                   (float)(int)*(short *)((long)&vertices->cx + lVar25),
                   (float)(int)*(short *)((long)&vertices->cy + lVar25),
                   (float)(int)*(short *)((long)&vertices->x + lVar25),
                   (float)(int)*(short *)((long)&vertices->y + lVar25),fVar27,0);
        goto LAB_00182a35;
      case '\x04':
        stbtt__tesselate_cubic
                  (points,(int *)&local_238,fVar29,fVar39,
                   (float)(int)*(short *)((long)&vertices->cx + lVar25),
                   (float)(int)*(short *)((long)&vertices->cy + lVar25),
                   (float)(int)*(short *)((long)&vertices->cx1 + lVar25),
                   (float)(int)*(short *)((long)&vertices->cy1 + lVar25),
                   (float)(int)*(short *)((long)&vertices->x + lVar25),
                   (float)(int)*(short *)((long)&vertices->y + lVar25),fVar27,0);
LAB_00182a35:
        auVar31 = ZEXT416(*(uint *)((long)&vertices->x + lVar25));
        auVar31 = pshuflw(auVar31,auVar31,0x60);
        fVar29 = (float)(auVar31._0_4_ >> 0x10);
        fVar39 = (float)(auVar31._4_4_ >> 0x10);
      }
    }
    (&__ptr->x)[(int)uVar20] = (float)((int)(float)local_238 - (int)fVar28);
    iVar21 = iVar21 + 1;
    fVar29 = (float)local_238;
  } while( true );
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale            = scale_x > scale_y ? scale_y : scale_x;
   int winding_count      = 0;
   int *winding_lengths   = NULL;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}